

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall QJsonArray::QJsonArray(QJsonArray *this,initializer_list<QJsonValue> args)

{
  QCborContainerPrivate *pQVar1;
  QJsonValue *value;
  qsizetype i;
  long lVar2;
  
  value = args._M_array;
  (this->a).d.ptr = (QCborContainerPrivate *)0x0;
  if (args._M_len != 0) {
    lVar2 = args._M_len * 0x18;
    pQVar1 = (QCborContainerPrivate *)0x0;
    while( true ) {
      lVar2 = lVar2 + -0x18;
      if (pQVar1 == (QCborContainerPrivate *)0x0) {
        i = 0;
      }
      else {
        i = (pQVar1->elements).d.size;
      }
      insert(this,i,value);
      if (lVar2 == 0) break;
      value = value + 1;
      pQVar1 = (this->a).d.ptr;
    }
  }
  return;
}

Assistant:

explicit constexpr totally_ordered_wrapper(P p) noexcept : ptr(p) {}